

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

WCHAR * DumpCallStackFull(uint frameCount,bool print)

{
  ScriptContext *scriptContext;
  BOOL BVar1;
  int iVar2;
  ThreadContext *pTVar3;
  void *pvVar4;
  JavascriptFunction *this;
  FunctionBody *this_00;
  CallInfo CVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  Var *ppvVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  char16 local_598 [4];
  WCHAR buffer [512];
  char16 debugStringBuffer [42];
  undefined1 local_138 [8];
  JavascriptStackWalker walker;
  StringBuilder<Memory::ArenaAllocator> sb;
  char16_t *local_50;
  WCHAR *sourceFileName;
  uint local_40;
  ULONG local_3c;
  LONG local_38;
  ULONG line;
  LONG column;
  
  sourceFileName._4_4_ = (undefined4)CONCAT71(in_register_00000031,print);
  local_40 = frameCount;
  pTVar3 = ThreadContext::GetContextForCurrentThread();
  scriptContext = pTVar3->scriptContextList;
  Js::JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_138,scriptContext,true,(PVOID)0x0,false);
  walker.currentFrame.stackCheckCodeHeight = (size_t)&scriptContext->generalAllocator;
  line = 0;
  do {
    do {
      BVar1 = Js::JavascriptStackWalker::Walk((JavascriptStackWalker *)local_138,true);
      if (BVar1 == 0) goto LAB_006c3dd1;
      pvVar4 = Js::JavascriptStackWalker::GetCurrentCodeAddr((JavascriptStackWalker *)local_138);
    } while (((walker.inlinedFrameCallInfo._0_2_ & 4) == 0) &&
            ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0));
    StringCchPrintfW(local_598,0x200,L"0x%p  ",pvVar4);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
               local_598);
    this = Js::JavascriptStackWalker::GetCurrentFunction((JavascriptStackWalker *)local_138,true);
    this_00 = Js::JavascriptFunction::GetFunctionBody(this);
    CVar5 = Js::JavascriptStackWalker::GetCallInfo((JavascriptStackWalker *)local_138,true);
    local_3c = 0;
    local_50 = L"NULL";
    local_38 = 0;
    Js::JavascriptStackWalker::GetSourcePosition
              ((JavascriptStackWalker *)local_138,&local_50,&local_3c,&local_38);
    iVar2 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
    pcVar6 = Js::FunctionProxy::GetDebugNumberSet
                       ((FunctionProxy *)this_00,(wchar (*) [42])(buffer + 0x1fc));
    uVar8 = CVar5._0_4_ & 0xffffff;
    StringCchPrintfW(local_598,0x200,L"%s [%s] (0x%p, Args=%u",CONCAT44(extraout_var,iVar2),pcVar6,
                     this,uVar8);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
               local_598);
    for (uVar9 = 0; (CVar5._0_4_ & 0xffffff) != uVar9; uVar9 = uVar9 + 1) {
      ppvVar7 = Js::JavascriptStackWalker::GetJavascriptArgs
                          ((JavascriptStackWalker *)local_138,false);
      StringCchPrintfW(local_598,0x200,L", 0x%p",ppvVar7[uVar9]);
      Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
                ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
                 local_598);
    }
    StringCchPrintfW(local_598,0x200,L")[%s (%u, %d)]\n",local_50,(ulong)(local_3c + 1),
                     (ulong)(local_38 + 1),uVar8);
    Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
              ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
               local_598);
    line = line + 1;
  } while (line < local_40);
LAB_006c3dd1:
  Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<72ul>
            ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
             (char16 (*) [72])0xe45226);
  pcVar6 = Js::StringBuilder<Memory::ArenaAllocator>::Detach
                     ((StringBuilder<Memory::ArenaAllocator> *)
                      &walker.currentFrame.stackCheckCodeHeight);
  if (sourceFileName._4_1_ != '\0') {
    Output::Print(pcVar6);
  }
  Js::JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_138);
  return pcVar6;
}

Assistant:

WCHAR* DumpCallStackFull(uint frameCount, bool print)
{
    Js::ScriptContext* scriptContext = ThreadContext::GetContextForCurrentThread()->GetScriptContextList();
    Js::JavascriptStackWalker walker(scriptContext);

    WCHAR buffer[512];
    Js::StringBuilder<ArenaAllocator> sb(scriptContext->GeneralAllocator());
    uint fc = 0;
    while (walker.Walk())
    {
        void * codeAddr = walker.GetCurrentCodeAddr();
        if (walker.IsJavascriptFrame())
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            StringCchPrintf(buffer, _countof(buffer), _u("0x%p  "), codeAddr);
            sb.AppendSz(buffer);
            // Found a JavascriptFunction.  Dump its name and parameters.
            Js::JavascriptFunction *jsFunc = walker.GetCurrentFunction();

            Js::FunctionBody * jsBody = jsFunc->GetFunctionBody();
            const Js::CallInfo callInfo = walker.GetCallInfo();
            const WCHAR* sourceFileName = _u("NULL");
            ULONG line = 0; LONG column = 0;
            walker.GetSourcePosition(&sourceFileName, &line, &column);

            StringCchPrintf(buffer, _countof(buffer), _u("%s [%s] (0x%p, Args=%u"), jsBody->GetDisplayName(), jsBody->GetDebugNumberSet(debugStringBuffer), jsFunc,
                callInfo.Count);
            sb.AppendSz(buffer);

            for (uint i = 0; i < callInfo.Count; i++)
            {
                StringCchPrintf(buffer, _countof(buffer), _u(", 0x%p"), walker.GetJavascriptArgs(false /*boxArgs*/)[i]);
                sb.AppendSz(buffer);
            }
            StringCchPrintf(buffer, _countof(buffer), _u(")[%s (%u, %d)]\n"), sourceFileName, line + 1, column + 1);
            sb.AppendSz(buffer);
            fc++;
            if(fc >= frameCount)
            {
                break;
            }
       }
    }
    sb.AppendCppLiteral(_u("----------------------------------------------------------------------\n"));
    WCHAR* stack = sb.Detach();
    if(print)
    {
        Output::Print(stack);
    }
    return stack;
}